

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall MarrayTest::resizeTest<(andres::CoordinateOrder)0>(MarrayTest *this)

{
  bool bVar1;
  pointer piVar2;
  bool bVar3;
  undefined4 uVar4;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var5;
  size_t sVar6;
  reference piVar7;
  size_t sVar8;
  size_t sVar9;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var10;
  logic_error *plVar11;
  code *pcVar12;
  CoordinateOrder CVar13;
  long lVar14;
  ulong uVar15;
  undefined *puVar16;
  int iVar17;
  ulong uVar18;
  uint args;
  int scalar_1;
  int scalar;
  Marray<int,_std::allocator<unsigned_long>_> m;
  CoordinateOrder local_a8;
  int local_a4;
  MarrayTest *local_a0;
  Marray<int,_std::allocator<unsigned_long>_> local_98;
  unsigned_long *local_50;
  ulong local_48;
  unsigned_long *local_40;
  unsigned_long *local_38;
  
  _Var5._M_current = (unsigned_long *)operator_new(8);
  *_Var5._M_current = 0x18;
  local_a8 = FirstMajorOrder;
  local_a0 = this;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&local_98,_Var5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var5._M_current + 1),&this->scalar_,&local_a8,(allocator_type *)&local_a4);
  *_Var5._M_current = 0xc;
  local_a8 = 0xc;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&local_98,_Var5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var5._M_current + 1),(int *)&local_a8);
  sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    (&local_98.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
  if ((sVar6 == 0xc) &&
     (local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ == 0xc)) {
    if (local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ == (pointer)0x0) {
      plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
      pcVar12 = std::runtime_error::~runtime_error;
      puVar16 = &std::runtime_error::typeinfo;
      goto LAB_001e987d;
    }
    if (local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.dimension_ == 1) {
      operator_delete(local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.data_,0x30);
      operator_delete(local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      shape_,local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.
                             geometry_.dimension_ * 0x18);
      operator_delete(_Var5._M_current,8);
      _Var5._M_current = (unsigned_long *)operator_new(8);
      *_Var5._M_current = 0x18;
      local_a8 = FirstMajorOrder;
      andres::Marray<int,std::allocator<unsigned_long>>::
      Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Marray<int,std::allocator<unsigned_long>> *)&local_98,_Var5,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(_Var5._M_current + 1),&local_a0->scalar_,&local_a8,(allocator_type *)&local_a4);
      local_a8 = LastMajorOrder;
      andres::Marray<int,std::allocator<unsigned_long>>::
      resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Marray<int,std::allocator<unsigned_long>> *)&local_98,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )0x0,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )0x0,(int *)&local_a8);
      operator_delete(local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                      local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      size_ << 2);
      operator_delete(local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      shape_,local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.
                             geometry_.dimension_ * 0x18);
      operator_delete(_Var5._M_current,8);
      _Var5._M_current = (unsigned_long *)operator_new(8);
      *_Var5._M_current = 0x18;
      local_a8 = FirstMajorOrder;
      andres::Marray<int,std::allocator<unsigned_long>>::
      Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Marray<int,std::allocator<unsigned_long>> *)&local_98,_Var5,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(_Var5._M_current + 1),&local_a0->scalar_,&local_a8,(allocator_type *)&local_a4);
      *_Var5._M_current = 1;
      local_a8 = 3;
      andres::Marray<int,std::allocator<unsigned_long>>::
      resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Marray<int,std::allocator<unsigned_long>> *)&local_98,_Var5,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(_Var5._M_current + 1),(int *)&local_a8);
      sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        (&local_98.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
      if ((sVar6 != 1) ||
         (local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ != 1)) {
LAB_001e9704:
        plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar11,"test failed.");
        __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      local_a8 = FirstMajorOrder;
      piVar7 = andres::marray_detail::AccessOperatorHelper<true>::
               execute<int,int,false,std::allocator<unsigned_long>>
                         (&local_98.super_View<int,_false,_std::allocator<unsigned_long>_>,
                          (int *)&local_a8);
      if (*piVar7 != local_a0->scalar_) goto LAB_001e9704;
      operator_delete(local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                      local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      size_ << 2);
      operator_delete(local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      shape_,local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.
                             geometry_.dimension_ * 0x18);
      operator_delete(_Var5._M_current,8);
      local_a4 = 1;
      _Var5._M_current = (unsigned_long *)operator_new(8);
      *_Var5._M_current = 0x18;
      andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
                (&local_98,&local_a4,&andres::defaultOrder,(allocator_type *)&local_a8);
      local_a8 = 3;
      andres::Marray<int,std::allocator<unsigned_long>>::
      resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Marray<int,std::allocator<unsigned_long>> *)&local_98,_Var5,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(_Var5._M_current + 1),(int *)&local_a8);
      sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        (&local_98.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
      if ((sVar6 == 0x18) &&
         (local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ == 0x18))
      {
        if (local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ == (pointer)0x0) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
          pcVar12 = std::runtime_error::~runtime_error;
          puVar16 = &std::runtime_error::typeinfo;
          goto LAB_001e98af;
        }
        if (local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.dimension_ ==
            1) {
          local_a8 = FirstMajorOrder;
          piVar7 = andres::marray_detail::AccessOperatorHelper<true>::
                   execute<int,int,false,std::allocator<unsigned_long>>
                             (&local_98.super_View<int,_false,_std::allocator<unsigned_long>_>,
                              (int *)&local_a8);
          if (*piVar7 != 1) {
            plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar11,"test failed.");
            __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          CVar13 = LastMajorOrder;
          do {
            local_a8 = CVar13;
            piVar7 = andres::marray_detail::AccessOperatorHelper<true>::
                     execute<int,int,false,std::allocator<unsigned_long>>
                               (&local_98.super_View<int,_false,_std::allocator<unsigned_long>_>,
                                (int *)&local_a8);
            if (*piVar7 != 3) {
              plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(plVar11,"test failed.");
              __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            CVar13 = CVar13 + LastMajorOrder;
          } while (CVar13 != 0x18);
          operator_delete(local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                          local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          size_ << 2);
          operator_delete(local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          shape_,local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                 geometry_.dimension_ * 0x18);
          operator_delete(_Var5._M_current,8);
          _Var5._M_current = (unsigned_long *)operator_new(8);
          *_Var5._M_current = 0xc;
          local_a8 = FirstMajorOrder;
          andres::Marray<int,std::allocator<unsigned_long>>::
          Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((Marray<int,std::allocator<unsigned_long>> *)&local_98,_Var5,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(_Var5._M_current + 1),&local_a0->scalar_,&local_a8,
                     (allocator_type *)&local_a4);
          *_Var5._M_current = 0x18;
          local_a8 = 3;
          andres::Marray<int,std::allocator<unsigned_long>>::
          resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((Marray<int,std::allocator<unsigned_long>> *)&local_98,_Var5,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(_Var5._M_current + 1),(int *)&local_a8);
          sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                            (&local_98.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
          if ((sVar6 == 0x18) &&
             (local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
              0x18)) {
            if (local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ ==
                (pointer)0x0) {
              plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error((runtime_error *)plVar11,"Assertion failed.");
              pcVar12 = std::runtime_error::~runtime_error;
              puVar16 = &std::runtime_error::typeinfo;
              goto LAB_001e9913;
            }
            if (local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.dimension_
                == 1) {
              CVar13 = FirstMajorOrder;
              do {
                local_a8 = CVar13;
                if (CVar13 < 0xc) {
                  piVar7 = andres::marray_detail::AccessOperatorHelper<true>::
                           execute<int,int,false,std::allocator<unsigned_long>>
                                     (&local_98.
                                       super_View<int,_false,_std::allocator<unsigned_long>_>,
                                      (int *)&local_a8);
                  if (*piVar7 != local_a0->scalar_) {
                    plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::logic_error::logic_error(plVar11,"test failed.");
                    __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
                  }
                }
                else {
                  piVar7 = andres::marray_detail::AccessOperatorHelper<true>::
                           execute<int,int,false,std::allocator<unsigned_long>>
                                     (&local_98.
                                       super_View<int,_false,_std::allocator<unsigned_long>_>,
                                      (int *)&local_a8);
                  if (*piVar7 != 3) {
                    plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::logic_error::logic_error(plVar11,"test failed.");
                    __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
                  }
                }
                CVar13 = CVar13 + LastMajorOrder;
              } while (CVar13 != 0x18);
              operator_delete(local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                              local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.size_ << 2);
              operator_delete(local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.shape_,
                              local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.dimension_ * 0x18);
              operator_delete(_Var5._M_current,8);
              local_a8 = LastMajorOrder;
              andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
                        (&local_98,(int *)&local_a8,&andres::defaultOrder,
                         (allocator_type *)&local_a4);
              local_50 = (unsigned_long *)operator_new(0x18);
              *local_50 = 5;
              local_50[1] = 5;
              local_50[2] = 2;
              local_a4 = 3;
              andres::Marray<int,std::allocator<unsigned_long>>::
              resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Marray<int,std::allocator<unsigned_long>> *)&local_98,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )local_50,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(local_50 + 3),&local_a4);
              sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                                (&local_98.super_View<int,_false,_std::allocator<unsigned_long>_>,0)
              ;
              if (sVar6 == 5) {
                sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                                  (&local_98.super_View<int,_false,_std::allocator<unsigned_long>_>,
                                   1);
                if (sVar6 == 5) {
                  sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                                    (&local_98.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>,2);
                  if ((sVar6 == 2) &&
                     (local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      size_ == 0x32)) {
                    if (local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ ==
                        (pointer)0x0) {
                      plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error
                                ((runtime_error *)plVar11,"Assertion failed.");
                      pcVar12 = std::runtime_error::~runtime_error;
                      puVar16 = &std::runtime_error::typeinfo;
                      goto LAB_001e95a7;
                    }
                    if (local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                        dimension_ == 3) {
                      iVar17 = 0;
                      uVar4 = 1;
                      do {
                        local_48 = CONCAT44(local_48._4_4_,uVar4);
                        sVar6 = 0;
                        do {
                          lVar14 = 0;
                          do {
                            if (((int)sVar6 == 0 && (int)lVar14 == 0) && iVar17 == 0) {
                              andres::View<int,_false,_std::allocator<unsigned_long>_>::
                              testInvariant(&local_98.
                                             super_View<int,_false,_std::allocator<unsigned_long>_>)
                              ;
                              piVar2 = local_98.
                                       super_View<int,_false,_std::allocator<unsigned_long>_>.data_;
                              if ((local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                   data_ == (pointer)0x0) ||
                                 (local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.dimension_ != 3)) {
                                plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          ((runtime_error *)plVar11,"Assertion failed.");
                                pcVar12 = std::runtime_error::~runtime_error;
                                puVar16 = &std::runtime_error::typeinfo;
LAB_001e9179:
                                __cxa_throw(plVar11,puVar16,pcVar12);
                              }
                              andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                                        (&local_98.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>,0);
                              sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      elementAccessHelper<int>
                                                (&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                 ,3,0,0);
                              if (piVar2[sVar8] != 1) {
                                plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::logic_error::logic_error(plVar11,"test failed.");
                                pcVar12 = std::logic_error::~logic_error;
                                puVar16 = &std::logic_error::typeinfo;
                                goto LAB_001e9179;
                              }
                            }
                            else {
                              andres::View<int,_false,_std::allocator<unsigned_long>_>::
                              testInvariant(&local_98.
                                             super_View<int,_false,_std::allocator<unsigned_long>_>)
                              ;
                              piVar2 = local_98.
                                       super_View<int,_false,_std::allocator<unsigned_long>_>.data_;
                              if ((local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                   data_ == (pointer)0x0) ||
                                 (local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.dimension_ != 3)) {
                                plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          ((runtime_error *)plVar11,"Assertion failed.");
                                pcVar12 = std::runtime_error::~runtime_error;
                                puVar16 = &std::runtime_error::typeinfo;
LAB_001e90bd:
                                __cxa_throw(plVar11,puVar16,pcVar12);
                              }
                              sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      strides(&local_98.
                                               super_View<int,_false,_std::allocator<unsigned_long>_>
                                              ,0);
                              sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      elementAccessHelper<int>
                                                (&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                 ,3,sVar6,iVar17);
                              if (piVar2[sVar8 * lVar14 + sVar9] != 3) {
                                plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::logic_error::logic_error(plVar11,"test failed.");
                                pcVar12 = std::logic_error::~logic_error;
                                puVar16 = &std::logic_error::typeinfo;
                                goto LAB_001e90bd;
                              }
                            }
                            lVar14 = lVar14 + 1;
                          } while (lVar14 != 5);
                          sVar6 = sVar6 + 1;
                        } while (sVar6 != 5);
                        iVar17 = 1;
                        uVar4 = 0;
                      } while ((local_48 & 1) != 0);
                      operator_delete(local_50,0x18);
                      operator_delete(local_98.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                                      local_98.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.size_ << 2);
                      operator_delete(local_98.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.shape_,
                                      local_98.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.dimension_ * 0x18);
                      local_40 = (unsigned_long *)operator_new(8);
                      *local_40 = 0xc;
                      local_a8 = FirstMajorOrder;
                      andres::Marray<int,std::allocator<unsigned_long>>::
                      Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                ((Marray<int,std::allocator<unsigned_long>> *)&local_98,
                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  )local_40,
                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  )(local_40 + 1),&local_a0->scalar_,&local_a8,
                                 (allocator_type *)&local_a4);
                      local_38 = (unsigned_long *)operator_new(0x18);
                      *local_38 = 5;
                      local_38[1] = 5;
                      local_38[2] = 2;
                      local_a8 = 3;
                      andres::Marray<int,std::allocator<unsigned_long>>::
                      resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                ((Marray<int,std::allocator<unsigned_long>> *)&local_98,
                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  )local_38,
                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  )(local_38 + 3),(int *)&local_a8);
                      sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                                        (&local_98.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>,0);
                      if (sVar6 == 5) {
                        sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                                          (&local_98.
                                            super_View<int,_false,_std::allocator<unsigned_long>_>,1
                                          );
                        if (sVar6 == 5) {
                          sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                                            (&local_98.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                             ,2);
                          if ((sVar6 == 2) &&
                             (local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.size_ == 0x32)) {
                            if (local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                data_ == (pointer)0x0) {
                              plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error
                                        ((runtime_error *)plVar11,"Assertion failed.");
                              pcVar12 = std::runtime_error::~runtime_error;
                              puVar16 = &std::runtime_error::typeinfo;
                              goto LAB_001e95d9;
                            }
                            if (local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                geometry_.dimension_ == 3) {
                              local_48 = 0;
                              uVar4 = 1;
                              do {
                                local_50 = (unsigned_long *)CONCAT44(local_50._4_4_,uVar4);
                                sVar6 = 0;
                                do {
                                  iVar17 = (int)local_48;
                                  lVar14 = 0;
                                  do {
                                    if (iVar17 == 0 && (int)sVar6 == 0) {
                                      andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      testInvariant(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                      piVar2 = local_98.
                                               super_View<int,_false,_std::allocator<unsigned_long>_>
                                               .data_;
                                      if ((local_98.
                                           super_View<int,_false,_std::allocator<unsigned_long>_>.
                                           data_ == (pointer)0x0) ||
                                         (local_98.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.dimension_ != 3)) {
                                        plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  ((runtime_error *)plVar11,"Assertion failed.");
                                        pcVar12 = std::runtime_error::~runtime_error;
                                        puVar16 = &std::runtime_error::typeinfo;
LAB_001e9293:
                                        __cxa_throw(plVar11,puVar16,pcVar12);
                                      }
                                      sVar8 = andres::
                                              View<int,_false,_std::allocator<unsigned_long>_>::
                                              strides(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                      sVar9 = andres::
                                              View<int,_false,_std::allocator<unsigned_long>_>::
                                              elementAccessHelper<int>
                                                        (&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,0,0);
                                      if (piVar2[sVar8 * lVar14 + sVar9] != local_a0->scalar_) {
                                        plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::logic_error::logic_error(plVar11,"test failed.");
                                        pcVar12 = std::logic_error::~logic_error;
                                        puVar16 = &std::logic_error::typeinfo;
                                        goto LAB_001e9293;
                                      }
                                    }
                                    else {
                                      andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      testInvariant(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                      piVar2 = local_98.
                                               super_View<int,_false,_std::allocator<unsigned_long>_>
                                               .data_;
                                      if ((local_98.
                                           super_View<int,_false,_std::allocator<unsigned_long>_>.
                                           data_ == (pointer)0x0) ||
                                         (local_98.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.dimension_ != 3)) {
                                        plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  ((runtime_error *)plVar11,"Assertion failed.");
                                        pcVar12 = std::runtime_error::~runtime_error;
                                        puVar16 = &std::runtime_error::typeinfo;
LAB_001e911b:
                                        __cxa_throw(plVar11,puVar16,pcVar12);
                                      }
                                      sVar8 = andres::
                                              View<int,_false,_std::allocator<unsigned_long>_>::
                                              strides(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                      sVar9 = andres::
                                              View<int,_false,_std::allocator<unsigned_long>_>::
                                              elementAccessHelper<int>
                                                        (&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,sVar6,(int)local_48);
                                      if (piVar2[sVar8 * lVar14 + sVar9] != 3) {
                                        plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::logic_error::logic_error(plVar11,"test failed.");
                                        pcVar12 = std::logic_error::~logic_error;
                                        puVar16 = &std::logic_error::typeinfo;
                                        goto LAB_001e911b;
                                      }
                                    }
                                    lVar14 = lVar14 + 1;
                                  } while (lVar14 != 5);
                                  sVar6 = sVar6 + 1;
                                } while (sVar6 != 5);
                                local_48 = 1;
                                uVar4 = 0;
                              } while (((ulong)local_50 & 1) != 0);
                              operator_delete(local_38,0x18);
                              operator_delete(local_98.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .data_,local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                              operator_delete(local_98.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.shape_,
                                              local_98.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.dimension_ * 0x18);
                              operator_delete(local_40,8);
                              _Var5._M_current = (unsigned_long *)operator_new(0x10);
                              *_Var5._M_current = 6;
                              _Var5._M_current[1] = 4;
                              local_a8 = FirstMajorOrder;
                              andres::Marray<int,std::allocator<unsigned_long>>::
                              Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                        ((Marray<int,std::allocator<unsigned_long>> *)&local_98,
                                         _Var5,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                )(_Var5._M_current + 2),&local_a0->scalar_,&local_a8
                                         ,(allocator_type *)&local_a4);
                              *_Var5._M_current = 3;
                              _Var5._M_current[1] = 2;
                              local_a8 = 6;
                              andres::Marray<int,std::allocator<unsigned_long>>::
                              resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                        ((Marray<int,std::allocator<unsigned_long>> *)&local_98,
                                         _Var5,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                )(_Var5._M_current + 2),(int *)&local_a8);
                              sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      shape(&local_98.
                                             super_View<int,_false,_std::allocator<unsigned_long>_>,
                                            0);
                              if (sVar6 == 3) {
                                sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                        shape(&local_98.
                                               super_View<int,_false,_std::allocator<unsigned_long>_>
                                              ,1);
                                if ((sVar6 == 2) &&
                                   (local_98.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                    geometry_.size_ == 6)) {
                                  if (local_98.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.data_
                                      == (pointer)0x0) {
                                    plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar11,"Assertion failed.");
                                    pcVar12 = std::runtime_error::~runtime_error;
                                    puVar16 = &std::runtime_error::typeinfo;
                                    goto LAB_001e99a3;
                                  }
                                  if (local_98.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.dimension_ == 2) {
                                    operator_delete(local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,0x18);
                                    operator_delete(local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                    operator_delete(_Var5._M_current,0x10);
                                    _Var5._M_current = (unsigned_long *)operator_new(0x10);
                                    *_Var5._M_current = 3;
                                    _Var5._M_current[1] = 2;
                                    local_a8 = FirstMajorOrder;
                                    andres::Marray<int,std::allocator<unsigned_long>>::
                                    Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                              ((Marray<int,std::allocator<unsigned_long>> *)
                                               &local_98,_Var5,
                                               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                )(_Var5._M_current + 2),&local_a0->scalar_,&local_a8
                                               ,(allocator_type *)&local_a4);
                                    *_Var5._M_current = 6;
                                    _Var5._M_current[1] = 4;
                                    local_a8 = 3;
                                    andres::Marray<int,std::allocator<unsigned_long>>::
                                    resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                              ((Marray<int,std::allocator<unsigned_long>> *)
                                               &local_98,_Var5,
                                               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                )(_Var5._M_current + 2),(int *)&local_a8);
                                    sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>
                                            ::shape(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                    if (sVar6 == 6) {
                                      sVar6 = andres::
                                              View<int,_false,_std::allocator<unsigned_long>_>::
                                              shape(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,1);
                                      if ((sVar6 == 4) &&
                                         (local_98.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.size_ == 0x18)) {
                                        if (local_98.
                                            super_View<int,_false,_std::allocator<unsigned_long>_>.
                                            data_ == (pointer)0x0) {
                                          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::runtime_error::runtime_error
                                                    ((runtime_error *)plVar11,"Assertion failed.");
                                          pcVar12 = std::runtime_error::~runtime_error;
                                          puVar16 = &std::runtime_error::typeinfo;
                                          goto LAB_001e99d5;
                                        }
                                        if (local_98.
                                            super_View<int,_false,_std::allocator<unsigned_long>_>.
                                            geometry_.dimension_ == 2) {
                                          args = 0;
                                          do {
                                            uVar18 = 0;
                                            do {
                                              if (uVar18 < 3 && args < 2) {
                                                piVar7 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_98,uVar18,args);
                                                if (*piVar7 != local_a0->scalar_) {
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar11,"test failed.");
                                                  __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                              std::logic_error::~logic_error);
                                                }
                                              }
                                              else {
                                                piVar7 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_98,uVar18,args);
                                                if (*piVar7 != 3) {
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar11,"test failed.");
                                                  __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                              std::logic_error::~logic_error);
                                                }
                                              }
                                              uVar18 = uVar18 + 1;
                                            } while (uVar18 != 6);
                                            args = args + 1;
                                          } while (args != 4);
                                          operator_delete(local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                          operator_delete(local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                          operator_delete(_Var5._M_current,0x10);
                                          _Var5._M_current = (unsigned_long *)operator_new(0x10);
                                          *_Var5._M_current = 6;
                                          _Var5._M_current[1] = 4;
                                          local_a8 = FirstMajorOrder;
                                          andres::Marray<int,std::allocator<unsigned_long>>::
                                          Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                    ((Marray<int,std::allocator<unsigned_long>> *)
                                                     &local_98,_Var5,
                                                     (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var5._M_current + 2),&local_a0->scalar_,
                                                  &local_a8,(allocator_type *)&local_a4);
                                          local_a8 = 3;
                                          andres::Marray<int,std::allocator<unsigned_long>>::
                                          resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                    ((Marray<int,std::allocator<unsigned_long>> *)
                                                     &local_98,
                                                     (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )0x0,(
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )0x0,(int *)&local_a8);
                                          operator_delete(local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                          operator_delete(local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                          operator_delete(_Var5._M_current,0x10);
                                          _Var5._M_current = (unsigned_long *)operator_new(0x10);
                                          *_Var5._M_current = 6;
                                          _Var5._M_current[1] = 4;
                                          local_a8 = FirstMajorOrder;
                                          andres::Marray<int,std::allocator<unsigned_long>>::
                                          Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                    ((Marray<int,std::allocator<unsigned_long>> *)
                                                     &local_98,_Var5,
                                                     (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var5._M_current + 2),&local_a0->scalar_,
                                                  &local_a8,(allocator_type *)&local_a4);
                                          _Var10._M_current = (unsigned_long *)operator_new(8);
                                          *_Var10._M_current = 0xc;
                                          local_a8 = 3;
                                          andres::Marray<int,std::allocator<unsigned_long>>::
                                          resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                    ((Marray<int,std::allocator<unsigned_long>> *)
                                                     &local_98,_Var10,
                                                     (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var10._M_current + 1),(int *)&local_a8);
                                          sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                          if ((sVar6 != 0xc) ||
                                             (local_98.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.size_ != 0xc)) {
                                            plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::logic_error::logic_error(plVar11,"test failed.");
                                            __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                        std::logic_error::~logic_error);
                                          }
                                          operator_delete(_Var10._M_current,8);
                                          operator_delete(local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                          operator_delete(local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                          operator_delete(_Var5._M_current,0x10);
                                          _Var5._M_current = (unsigned_long *)operator_new(0x10);
                                          *_Var5._M_current = 6;
                                          _Var5._M_current[1] = 4;
                                          local_a8 = FirstMajorOrder;
                                          andres::Marray<int,std::allocator<unsigned_long>>::
                                          Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                    ((Marray<int,std::allocator<unsigned_long>> *)
                                                     &local_98,_Var5,
                                                     (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var5._M_current + 2),&local_a0->scalar_,
                                                  &local_a8,(allocator_type *)&local_a4);
                                          _Var10._M_current = (unsigned_long *)operator_new(8);
                                          *_Var10._M_current = 0xc;
                                          local_a8 = 3;
                                          andres::Marray<int,std::allocator<unsigned_long>>::
                                          resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                    ((Marray<int,std::allocator<unsigned_long>> *)
                                                     &local_98,_Var10,
                                                     (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var10._M_current + 1),(int *)&local_a8);
                                          sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                          if ((sVar6 == 0xc) &&
                                             (local_98.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.size_ == 0xc)) {
                                            if (local_98.
                                                super_View<int,_false,_std::allocator<unsigned_long>_>
                                                .data_ == (pointer)0x0) {
                                              plVar11 = (logic_error *)
                                                        __cxa_allocate_exception(0x10);
                                              std::runtime_error::runtime_error
                                                        ((runtime_error *)plVar11,
                                                         "Assertion failed.");
                                              pcVar12 = std::runtime_error::~runtime_error;
                                              puVar16 = &std::runtime_error::typeinfo;
                                              goto LAB_001e9a39;
                                            }
                                            if (local_98.
                                                super_View<int,_false,_std::allocator<unsigned_long>_>
                                                .geometry_.dimension_ == 1) {
                                              CVar13 = FirstMajorOrder;
                                              do {
                                                local_a8 = CVar13;
                                                piVar7 = andres::marray_detail::
                                                         AccessOperatorHelper<true>::
                                                                                                                  
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,(int *)&local_a8);
                                                if (*piVar7 != local_a0->scalar_) {
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar11,"test failed.");
                                                  __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                              std::logic_error::~logic_error);
                                                }
                                                CVar13 = CVar13 + LastMajorOrder;
                                              } while (CVar13 != 6);
                                              CVar13 = 6;
                                              do {
                                                local_a8 = CVar13;
                                                piVar7 = andres::marray_detail::
                                                         AccessOperatorHelper<true>::
                                                                                                                  
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,(int *)&local_a8);
                                                if (*piVar7 != 3) {
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar11,"test failed.");
                                                  __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                              std::logic_error::~logic_error);
                                                }
                                                CVar13 = CVar13 + LastMajorOrder;
                                              } while (CVar13 != 0xc);
                                              operator_delete(_Var10._M_current,8);
                                              operator_delete(local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                              operator_delete(local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                              operator_delete(_Var5._M_current,0x10);
                                              local_50 = (unsigned_long *)operator_new(0x10);
                                              *local_50 = 3;
                                              local_50[1] = 2;
                                              local_a8 = FirstMajorOrder;
                                              andres::Marray<int,std::allocator<unsigned_long>>::
                                              Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                        ((Marray<int,std::allocator<unsigned_long>>
                                                          *)&local_98,
                                                         (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_50,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_50 + 2),&local_a0->scalar_,&local_a8,
                                                  (allocator_type *)&local_a4);
                                              local_40 = (unsigned_long *)operator_new(0x18);
                                              *local_40 = 5;
                                              local_40[1] = 5;
                                              local_40[2] = 2;
                                              local_a8 = 3;
                                              andres::Marray<int,std::allocator<unsigned_long>>::
                                              resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                        ((Marray<int,std::allocator<unsigned_long>>
                                                          *)&local_98,
                                                         (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_40,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_40 + 3),(int *)&local_a8);
                                              sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                              if (sVar6 == 5) {
                                                sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,1);
                                                if (sVar6 == 5) {
                                                  sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,2);
                                                  if ((sVar6 == 2) &&
                                                     (local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ == 0x32)) {
                                                    if (local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
                                                    pcVar12 = std::runtime_error::~runtime_error;
                                                    puVar16 = &std::runtime_error::typeinfo;
                                                    goto LAB_001e960b;
                                                  }
                                                  if (local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ == 3) {
                                                    local_48 = 0;
                                                    bVar3 = true;
                                                    do {
                                                      bVar1 = bVar3;
                                                      uVar18 = 0;
                                                      do {
                                                        uVar15 = 0;
                                                        do {
                                                          if ((bool)((uVar15 < 3 && uVar18 < 2) &
                                                                    bVar1)) {
                                                            andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  piVar2 = local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_;
                                                  if ((local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) ||
                                                  (local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != 3)) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
                                                    pcVar12 = std::runtime_error::~runtime_error;
                                                    puVar16 = &std::runtime_error::typeinfo;
LAB_001e91d7:
                                                    __cxa_throw(plVar11,puVar16,pcVar12);
                                                  }
                                                  sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,uVar18,0);
                                                  if (piVar2[sVar6 * uVar15 + sVar8] !=
                                                      local_a0->scalar_) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    pcVar12 = std::logic_error::~logic_error;
                                                    puVar16 = &std::logic_error::typeinfo;
                                                    goto LAB_001e91d7;
                                                  }
                                                  }
                                                  else {
                                                    andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  piVar2 = local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_;
                                                  if ((local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) ||
                                                  (local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != 3)) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
                                                    pcVar12 = std::runtime_error::~runtime_error;
                                                    puVar16 = &std::runtime_error::typeinfo;
LAB_001e9235:
                                                    __cxa_throw(plVar11,puVar16,pcVar12);
                                                  }
                                                  sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,uVar18,(int)local_48);
                                                  if (piVar2[sVar6 * uVar15 + sVar8] != 3) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    pcVar12 = std::logic_error::~logic_error;
                                                    puVar16 = &std::logic_error::typeinfo;
                                                    goto LAB_001e9235;
                                                  }
                                                  }
                                                  uVar15 = uVar15 + 1;
                                                  } while (uVar15 != 5);
                                                  uVar18 = uVar18 + 1;
                                                  } while (uVar18 != 5);
                                                  local_48 = 1;
                                                  bVar3 = false;
                                                  } while (bVar1);
                                                  operator_delete(local_40,0x18);
                                                  operator_delete(local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_50,0x10);
                                                  _Var5._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var5._M_current = 3;
                                                  _Var5._M_current[1] = 4;
                                                  _Var5._M_current[2] = 2;
                                                  local_a8 = FirstMajorOrder;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_98,_Var5,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var5._M_current + 3),&local_a0->scalar_,
                                                  &local_a8,(allocator_type *)&local_a4);
                                                  *_Var5._M_current = 2;
                                                  _Var5._M_current[1] = 2;
                                                  _Var5._M_current[2] = 2;
                                                  local_a8 = 8;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_98,_Var5,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var5._M_current + 3),(int *)&local_a8);
                                                  sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  if (sVar6 == 2) {
                                                    sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,1);
                                                  if (sVar6 == 2) {
                                                    sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,2);
                                                  if ((sVar6 == 2) &&
                                                     (local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ == 8)) {
                                                    if (local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
                                                    pcVar12 = std::runtime_error::~runtime_error;
                                                    puVar16 = &std::runtime_error::typeinfo;
                                                    goto LAB_001e963d;
                                                  }
                                                  if (local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ == 3) {
                                                    operator_delete(local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,0x20);
                                                  operator_delete(local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(_Var5._M_current,0x18);
                                                  _Var5._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var5._M_current = 3;
                                                  _Var5._M_current[1] = 4;
                                                  _Var5._M_current[2] = 2;
                                                  local_a8 = FirstMajorOrder;
                                                  local_50 = _Var5._M_current;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_98,_Var5,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var5._M_current + 3),&local_a0->scalar_,
                                                  &local_a8,(allocator_type *)&local_a4);
                                                  *_Var5._M_current = 5;
                                                  _Var5._M_current[1] = 5;
                                                  _Var5._M_current[2] = 2;
                                                  local_a8 = 3;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_98,_Var5,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var5._M_current + 3),(int *)&local_a8);
                                                  sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  if (sVar6 == 5) {
                                                    sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,1);
                                                  if (sVar6 == 5) {
                                                    sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,2);
                                                  if ((sVar6 == 2) &&
                                                     (local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ == 0x32)) {
                                                    if (local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
                                                    pcVar12 = std::runtime_error::~runtime_error;
                                                    puVar16 = &std::runtime_error::typeinfo;
                                                    goto LAB_001e966f;
                                                  }
                                                  if (local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ == 3) {
                                                    iVar17 = 0;
                                                    uVar4 = 1;
                                                    do {
                                                      local_48 = CONCAT44(local_48._4_4_,uVar4);
                                                      sVar6 = 0;
                                                      do {
                                                        uVar18 = 0;
                                                        do {
                                                          if (uVar18 < 3 && sVar6 != 4) {
                                                            andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  piVar2 = local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_;
                                                  if ((local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) ||
                                                  (local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != 3)) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
                                                    pcVar12 = std::runtime_error::~runtime_error;
                                                    puVar16 = &std::runtime_error::typeinfo;
LAB_001e92f1:
                                                    __cxa_throw(plVar11,puVar16,pcVar12);
                                                  }
                                                  sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,sVar6,iVar17);
                                                  if (piVar2[sVar8 * uVar18 + sVar9] !=
                                                      local_a0->scalar_) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    pcVar12 = std::logic_error::~logic_error;
                                                    puVar16 = &std::logic_error::typeinfo;
                                                    goto LAB_001e92f1;
                                                  }
                                                  }
                                                  else {
                                                    andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  piVar2 = local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_;
                                                  if ((local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) ||
                                                  (local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != 3)) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
                                                    pcVar12 = std::runtime_error::~runtime_error;
                                                    puVar16 = &std::runtime_error::typeinfo;
LAB_001e934f:
                                                    __cxa_throw(plVar11,puVar16,pcVar12);
                                                  }
                                                  sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,sVar6,iVar17);
                                                  if (piVar2[sVar8 * uVar18 + sVar9] != 3) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    pcVar12 = std::logic_error::~logic_error;
                                                    puVar16 = &std::logic_error::typeinfo;
                                                    goto LAB_001e934f;
                                                  }
                                                  }
                                                  uVar18 = uVar18 + 1;
                                                  } while (uVar18 != 5);
                                                  sVar6 = sVar6 + 1;
                                                  } while (sVar6 != 5);
                                                  iVar17 = 1;
                                                  uVar4 = 0;
                                                  } while ((local_48 & 1) != 0);
                                                  operator_delete(local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_50,0x18);
                                                  _Var5._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var5._M_current = 3;
                                                  _Var5._M_current[1] = 4;
                                                  _Var5._M_current[2] = 2;
                                                  local_a8 = FirstMajorOrder;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_98,_Var5,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var5._M_current + 3),&local_a0->scalar_,
                                                  &local_a8,(allocator_type *)&local_a4);
                                                  local_a8 = 3;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_98,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )0x0,(
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )0x0,(int *)&local_a8);
                                                  operator_delete(local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(_Var5._M_current,0x18);
                                                  _Var5._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var5._M_current = 3;
                                                  _Var5._M_current[1] = 4;
                                                  _Var5._M_current[2] = 2;
                                                  local_a8 = FirstMajorOrder;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_98,_Var5,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var5._M_current + 3),&local_a0->scalar_,
                                                  &local_a8,(allocator_type *)&local_a4);
                                                  _Var10._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var10._M_current = 0xc;
                                                  local_a8 = 3;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_98,_Var10,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var10._M_current + 1),(int *)&local_a8);
                                                  sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  if ((sVar6 != 0xc) ||
                                                     (local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ != 0xc)) {
LAB_001e97f2:
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  local_a8 = FirstMajorOrder;
                                                  piVar7 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,(int *)&local_a8);
                                                  if (*piVar7 != local_a0->scalar_)
                                                  goto LAB_001e97f2;
                                                  operator_delete(_Var10._M_current,8);
                                                  operator_delete(local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(_Var5._M_current,0x18);
                                                  _Var5._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var5._M_current = 3;
                                                  _Var5._M_current[1] = 4;
                                                  _Var5._M_current[2] = 2;
                                                  local_a8 = FirstMajorOrder;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_98,_Var5,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var5._M_current + 3),&local_a0->scalar_,
                                                  &local_a8,(allocator_type *)&local_a4);
                                                  _Var10._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var10._M_current = 0xc;
                                                  local_a8 = 3;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_98,_Var10,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var10._M_current + 1),(int *)&local_a8);
                                                  sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  if ((sVar6 == 0xc) &&
                                                     (local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ == 0xc)) {
                                                    if (local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
                                                    pcVar12 = std::runtime_error::~runtime_error;
                                                    puVar16 = &std::runtime_error::typeinfo;
                                                    goto LAB_001e9af8;
                                                  }
                                                  if (local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ == 1) {
                                                    CVar13 = FirstMajorOrder;
                                                    do {
                                                      local_a8 = CVar13;
                                                      piVar7 = andres::marray_detail::
                                                               AccessOperatorHelper<true>::
                                                                                                                              
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,(int *)&local_a8);
                                                  if (*piVar7 != local_a0->scalar_) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  CVar13 = CVar13 + LastMajorOrder;
                                                  } while (CVar13 != 3);
                                                  CVar13 = 3;
                                                  do {
                                                    local_a8 = CVar13;
                                                    piVar7 = andres::marray_detail::
                                                             AccessOperatorHelper<true>::
                                                                                                                          
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,(int *)&local_a8);
                                                  if (*piVar7 != 3) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  CVar13 = CVar13 + LastMajorOrder;
                                                  } while (CVar13 != 0xc);
                                                  operator_delete(_Var10._M_current,8);
                                                  operator_delete(local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(_Var5._M_current,0x18);
                                                  _Var5._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var5._M_current = 3;
                                                  _Var5._M_current[1] = 4;
                                                  _Var5._M_current[2] = 2;
                                                  local_a8 = FirstMajorOrder;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_98,_Var5,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var5._M_current + 3),&local_a0->scalar_,
                                                  &local_a8,(allocator_type *)&local_a4);
                                                  _Var10._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var10._M_current = 6;
                                                  _Var10._M_current[1] = 4;
                                                  local_a8 = 3;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_98,_Var10,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var10._M_current + 2),(int *)&local_a8);
                                                  sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  if (sVar6 == 6) {
                                                    sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,1);
                                                  if ((sVar6 == 4) &&
                                                     (local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ == 0x18)) {
                                                    if (local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar11,
                                                               "Assertion failed.");
                                                    pcVar12 = std::runtime_error::~runtime_error;
                                                    puVar16 = &std::runtime_error::typeinfo;
                                                    goto LAB_001e9b2a;
                                                  }
                                                  if (local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ == 2) {
                                                    iVar17 = 0;
                                                    do {
                                                      uVar18 = 0;
                                                      do {
                                                        if (uVar18 < 3) {
                                                          piVar7 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_98,uVar18,iVar17);
                                                  if (*piVar7 != local_a0->scalar_) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  }
                                                  else {
                                                    piVar7 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_98,uVar18,iVar17);
                                                  if (*piVar7 != 3) {
                                                    plVar11 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar11,"test failed.");
                                                    __cxa_throw(plVar11,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  }
                                                  uVar18 = uVar18 + 1;
                                                  } while (uVar18 != 6);
                                                  iVar17 = iVar17 + 1;
                                                  } while (iVar17 != 4);
                                                  operator_delete(_Var10._M_current,0x10);
                                                  operator_delete(local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_98.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(_Var5._M_current,0x18);
                                                  return;
                                                  }
                                                  }
                                                  }
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar11,"test failed.");
                                                  pcVar12 = std::logic_error::~logic_error;
                                                  puVar16 = &std::logic_error::typeinfo;
LAB_001e9b2a:
                                                  __cxa_throw(plVar11,puVar16,pcVar12);
                                                  }
                                                  }
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar11,"test failed.");
                                                  pcVar12 = std::logic_error::~logic_error;
                                                  puVar16 = &std::logic_error::typeinfo;
LAB_001e9af8:
                                                  __cxa_throw(plVar11,puVar16,pcVar12);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar11,"test failed.");
                                                  pcVar12 = std::logic_error::~logic_error;
                                                  puVar16 = &std::logic_error::typeinfo;
LAB_001e966f:
                                                  __cxa_throw(plVar11,puVar16,pcVar12);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  plVar11 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar11,"test failed.");
                                                  pcVar12 = std::logic_error::~logic_error;
                                                  puVar16 = &std::logic_error::typeinfo;
LAB_001e963d:
                                                  __cxa_throw(plVar11,puVar16,pcVar12);
                                                  }
                                                  }
                                                }
                                              }
                                              plVar11 = (logic_error *)
                                                        __cxa_allocate_exception(0x10);
                                              std::logic_error::logic_error(plVar11,"test failed.");
                                              pcVar12 = std::logic_error::~logic_error;
                                              puVar16 = &std::logic_error::typeinfo;
LAB_001e960b:
                                              __cxa_throw(plVar11,puVar16,pcVar12);
                                            }
                                          }
                                          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::logic_error::logic_error(plVar11,"test failed.");
                                          pcVar12 = std::logic_error::~logic_error;
                                          puVar16 = &std::logic_error::typeinfo;
LAB_001e9a39:
                                          __cxa_throw(plVar11,puVar16,pcVar12);
                                        }
                                      }
                                    }
                                    plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::logic_error::logic_error(plVar11,"test failed.");
                                    pcVar12 = std::logic_error::~logic_error;
                                    puVar16 = &std::logic_error::typeinfo;
LAB_001e99d5:
                                    __cxa_throw(plVar11,puVar16,pcVar12);
                                  }
                                }
                              }
                              plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error(plVar11,"test failed.");
                              pcVar12 = std::logic_error::~logic_error;
                              puVar16 = &std::logic_error::typeinfo;
LAB_001e99a3:
                              __cxa_throw(plVar11,puVar16,pcVar12);
                            }
                          }
                        }
                      }
                      plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::logic_error::logic_error(plVar11,"test failed.");
                      pcVar12 = std::logic_error::~logic_error;
                      puVar16 = &std::logic_error::typeinfo;
LAB_001e95d9:
                      __cxa_throw(plVar11,puVar16,pcVar12);
                    }
                  }
                }
              }
              plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(plVar11,"test failed.");
              pcVar12 = std::logic_error::~logic_error;
              puVar16 = &std::logic_error::typeinfo;
LAB_001e95a7:
              __cxa_throw(plVar11,puVar16,pcVar12);
            }
          }
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar11,"test failed.");
          pcVar12 = std::logic_error::~logic_error;
          puVar16 = &std::logic_error::typeinfo;
LAB_001e9913:
          __cxa_throw(plVar11,puVar16,pcVar12);
        }
      }
      plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar11,"test failed.");
      pcVar12 = std::logic_error::~logic_error;
      puVar16 = &std::logic_error::typeinfo;
LAB_001e98af:
      __cxa_throw(plVar11,puVar16,pcVar12);
    }
  }
  plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar11,"test failed.");
  pcVar12 = std::logic_error::~logic_error;
  puVar16 = &std::logic_error::typeinfo;
LAB_001e987d:
  __cxa_throw(plVar11,puVar16,pcVar12);
}

Assistant:

void MarrayTest::resizeTest() {
    // 1D
    {
        // shrink
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24; 
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 12; 
            m.resize(shape.begin(), shape.end(), 12);

            test(m.shape(0)==12 &&
                   m.size()==12 &&
                   m.dimension()==1);
        }
        // shrink to dimension == 0 
        {
            std::vector<std::size_t> shape(1), shape0(0);
            shape[0] = 24; 
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            m.resize(shape0.begin(), shape0.end(), 1);
        }
        // shrink to scalar 
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24; 
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 1; 
            m.resize(shape.begin(), shape.end(), 3);

            test(m.shape(0)==1 &&
                   m.size()==1 && 
                   m(0) == scalar_);
        }
        // grow scalar to 1D
        {
            int scalar = 1;
            std::vector<std::size_t> shape(1);
            shape[0] = 24; 
            andres::Marray<int> m(scalar);
            m.resize(shape.begin(), shape.end(), 3);

            test(m.shape(0)==24 &&
                   m.size()==24 &&
                   m.dimension() == 1);
            test(m(0) == 1);
            for(int i = 1; i < 24; ++i){
                test(m(i) == 3);
            }
        }
        // grow 1D
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 12; 
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 24; 
            m.resize(shape.begin(), shape.end(), 3);

            test(m.shape(0)==24 &&
                   m.size()==24 &&
                   m.dimension()==1);
            for(int i = 0; i < 24; ++i){
                if(i < 12) {
                    test(m(i) == scalar_);
                }
                else {
                    test(m(i) == 3); 
                }
            }
        }
        // grow scalar to 3D
        {
            int scalar = 1;
            andres::Marray<int> m(scalar); 
            std::vector<std::size_t> newShape(3);
            newShape[0] = 5;
            newShape[1] = 5; 
            newShape[2] = 2;
            m.resize(newShape.begin(), newShape.end(), 3);
        
            test(m.shape(0)==5 &&
                   m.shape(1)==5 &&
                   m.shape(2)==2 &&
                   m.size()==50 &&
                   m.dimension()==3);
            for(int z = 0; z < 2; ++z)
            for(int y = 0; y < 5; ++y){
                for(int x = 0; x < 5; ++x){
                    if(y == 0 && z == 0 && x == 0) {
                        test(m(x, y, z) == 1);
                    }
                    else {
                        test(m(x, y, z) == 3);
                    }
                }
            }
        }
        // grow to 3D
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 12; 
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder); 
            std::vector<std::size_t> newShape(3);
            newShape[0] = 5;
            newShape[1] = 5; 
            newShape[2] = 2;
            m.resize(newShape.begin(), newShape.end(), 3);
        
            test(m.shape(0)==5 &&
                   m.shape(1)==5 &&
                   m.shape(2)==2 &&
                   m.size()==50 &&
                   m.dimension()==3);
            for(int z = 0; z < 2; ++z)
            for(int y = 0; y < 5; ++y) {
                for(int x = 0; x < 5; ++x) {
                    if(y == 0 && z == 0 && x < 5) {
                        test(m(x, y, z) == scalar_);
                    }
                    else {
                        test(m(x, y, z) == 3);
                    }
                }
            }
        }
    }
    // 2D 
    {
        // shrink
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6; 
            shape[1] = 4;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 3; 
            shape[1] = 2; 
            m.resize(shape.begin(), shape.end(), 6);

            test(m.shape(0)==3 &&
                   m.shape(1)==2 &&
                   m.size()==6 &&
                   m.dimension()==2);
        }
        // grow
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 3; 
            shape[1] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 6; 
            shape[1] = 4; 
            m.resize(shape.begin(), shape.end(), 3);

            test(m.shape(0)==6 &&
                   m.shape(1)==4 &&
                   m.size()==24 &&
                   m.dimension()==2);
            for(int y = 0; y < 4; ++y){
                for(int x = 0; x < 6; ++x){
                    if(y < 2 && x < 3) {
                        test(m(x, y) == scalar_);
                    }
                    else {
                        test(m(x, y) == 3);
                    }
                }
            }
        }
        // shrink to dimension == 0
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6; 
            shape[1] = 4;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(0); 
            m.resize(newShape.begin(), newShape.end(), 3);
        }
        // shrink to scalar
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6; 
            shape[1] = 4;

            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(1); 
            newShape[0] = 12; 
            m.resize(newShape.begin(), newShape.end(), 3);

            test(m.shape(0)==12 &&
                   m.size()==12);
        }
        // shrink to 1D
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6; 
            shape[1] = 4;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(1); 
            newShape[0] = 12; 
            m.resize(newShape.begin(), newShape.end(), 3);

            test(m.shape(0)==12 &&
                   m.size()==12 &&
                   m.dimension()==1);
            for(int i = 0; i < 6; ++i)
                test(m(i) == scalar_);
            for(int i = 6; i < 12; ++i)
                test(m(i) == 3);
        }
        // grow to 3D
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 3; 
            shape[1] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(3);
            newShape[0] = 5;
            newShape[1] = 5; 
            newShape[2] = 2;
            m.resize(newShape.begin(), newShape.end(), 3);
        
            test(m.shape(0)==5 &&
                   m.shape(1)==5 &&
                   m.shape(2)==2 &&
                   m.size()==50 &&
                   m.dimension()==3);
            for(int z = 0; z < 2; ++z)
            for(int y = 0; y < 5; ++y){
                for(int x = 0; x < 5; ++x){
                    if(y < 2 && z == 0 && x < 3) {
                        test(m(x, y, z) == scalar_);
                    }
                    else {
                        test(m(x, y, z) == 3);
                    }
                }
            }
        }
    }
    // 3D
    {
        // shrink
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 2;
            shape[1] = 2; 
            shape[2] = 2;
            m.resize(shape.begin(), shape.end(), 8);
        
            test(m.shape(0)==2 &&
                   m.shape(1)==2 &&
                   m.shape(2)==2 &&
                   m.size()==8 &&
                   m.dimension()==3);
        }
        // grow
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 5;
            shape[1] = 5; 
            shape[2] = 2;
            m.resize(shape.begin(), shape.end(), 3);
        
            test(m.shape(0)==5 &&
                   m.shape(1)==5 &&
                   m.shape(2)==2 &&
                   m.size()==50 &&
                   m.dimension()==3);
            for(int z = 0; z < 2; ++z)
            for(int y = 0; y < 5; ++y){
                for(int x = 0; x < 5; ++x){
                    if(y < 4 && x < 3) {
                        test(m(x, y, z) == scalar_);
                    }                   
                    else {
                        test(m(x, y, z) == 3);
                    }
                }
            }
        }
        // shrink to dimension == 0
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(0); 
            m.resize(newShape.begin(), newShape.end(), 3);
        }
        // shrink to scalar
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(1); 
            newShape[0] = 12; 
            m.resize(newShape.begin(), newShape.end(), 3);

            test(m.shape(0)==12 &&
                   m.size()==12 &&
                   m(0) == scalar_);
        }
        // shrink to 1D
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(1); 
            newShape[0] = 12; 
            m.resize(newShape.begin(), newShape.end(), 3);

            test(m.shape(0)==12 &&
                   m.size()==12 &&
                   m.dimension()==1);
            for(int i = 0; i < 3; ++i)
                test(m(i) == scalar_);
            for(int i = 3; i < 12; ++i)
                test(m(i) == 3);
        }
        // shrink to 2D
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(2); 
            newShape[0] = 6; 
            newShape[1] = 4; 
            m.resize(newShape.begin(), newShape.end(), 3);

            test(m.shape(0)==6 &&
                   m.shape(1)==4 &&
                   m.size()==24 &&
                   m.dimension()==2);
            for(int y = 0; y < 4; ++y){
                for(int x = 0; x < 6; ++x){
                    if(y < 4 && x < 3) {
                        test(m(x, y) == scalar_);
                    }
                    else {
                        test(m(x, y) == 3);
                    }
                }
            }
        }
    }
}